

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# func_queue_examples.cpp
# Opt level: O0

void density_tests::FunctionQueueSamples<(density::function_type_erasure)0>::
     func_queue_reentrant_put_samples(ostream *i_ostream)

{
  void **ppvVar1;
  type_conflict tVar2;
  bool bVar3;
  double *pdVar4;
  void *this;
  value_type *pvVar5;
  Func_conflict *pFVar6;
  undefined1 local_158 [7];
  bool invoked_2;
  undefined1 local_140 [8];
  reentrant_put_transaction<Func> transaction_1;
  function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0>
  queue_4;
  undefined1 auStack_110 [7];
  bool invoked_1;
  char *local_108;
  reentrant_put_transaction<typename_std::decay<Func>::type> local_100;
  undefined1 local_e8 [8];
  reentrant_put_transaction<typename_std::decay<Func>::type> transaction;
  function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0>
  queue_3;
  undefined1 local_b8 [3];
  bool invoked;
  function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0>
  queue_2;
  undefined1 local_a0 [8];
  type return_value;
  undefined1 local_88 [4];
  int i;
  function_queue<double_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0>
  queue_1;
  anon_class_8_1_90f47376 func;
  double last_val;
  anon_class_1_0_00000001 local_51;
  undefined1 local_50 [8];
  function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0>
  queue;
  PrintScopeDuration dur;
  ostream *i_ostream_local;
  
  PrintScopeDuration::PrintScopeDuration
            ((PrintScopeDuration *)&queue.m_queue.m_tail,i_ostream,
             "function queue reentrant put samples");
  density::
  function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0>
  ::function_queue((function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0>
                    *)local_50);
  density::
  function_queue<void(),density::basic_default_allocator<65536ul>,(density::function_type_erasure)0>
  ::
  reentrant_push<density_tests::FunctionQueueSamples<(density::function_type_erasure)0>::func_queue_reentrant_put_samples(std::ostream&)::_lambda()_1_>
            ((function_queue<void(),density::basic_default_allocator<65536ul>,(density::function_type_erasure)0>
              *)local_50,&local_51);
  density::
  function_queue<void(),density::basic_default_allocator<65536ul>,(density::function_type_erasure)0>
  ::
  reentrant_push<density_tests::FunctionQueueSamples<(density::function_type_erasure)0>::func_queue_reentrant_put_samples(std::ostream&)::_lambda()_2_>
            ((function_queue<void(),density::basic_default_allocator<65536ul>,(density::function_type_erasure)0>
              *)local_50,(anon_class_1_0_00000001 *)((long)&last_val + 3));
  density::
  function_queue<void(),density::basic_default_allocator<65536ul>,(density::function_type_erasure)0>
  ::
  reentrant_push<density_tests::FunctionQueueSamples<(density::function_type_erasure)0>::func_queue_reentrant_put_samples(std::ostream&)::_lambda()_3_>
            ((function_queue<void(),density::basic_default_allocator<65536ul>,(density::function_type_erasure)0>
              *)local_50,(anon_class_1_0_00000001 *)((long)&last_val + 2));
  density::
  function_queue<void(),density::basic_default_allocator<65536ul>,(density::function_type_erasure)0>
  ::
  reentrant_push<density_tests::FunctionQueueSamples<(density::function_type_erasure)0>::func_queue_reentrant_put_samples(std::ostream&)::_lambda()_4_>
            ((function_queue<void(),density::basic_default_allocator<65536ul>,(density::function_type_erasure)0>
              *)local_50,(anon_class_1_0_00000001 *)((long)&last_val + 1));
  do {
    tVar2 = density::
            function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0>
            ::try_reentrant_consume
                      ((function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0>
                        *)local_50);
  } while (tVar2);
  density::
  function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0>
  ::~function_queue((function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0>
                     *)local_50);
  func.last_val = (double *)0x3ff0000000000000;
  queue_1.m_queue.m_tail = (ControlBlock *)&func;
  density::
  function_queue<double_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0>
  ::function_queue((function_queue<double_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0>
                    *)local_88);
  for (return_value._12_4_ = 0; (int)return_value._12_4_ < 10;
      return_value._12_4_ = return_value._12_4_ + 1) {
    density::
    function_queue<double(),density::basic_default_allocator<65536ul>,(density::function_type_erasure)0>
    ::
    reentrant_push<density_tests::FunctionQueueSamples<(density::function_type_erasure)0>::func_queue_reentrant_put_samples(std::ostream&)::_lambda()_5_&>
              ((function_queue<double(),density::basic_default_allocator<65536ul>,(density::function_type_erasure)0>
                *)local_88,(anon_class_8_1_90f47376 *)&queue_1.m_queue.m_tail);
  }
  do {
    density::
    function_queue<double_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0>
    ::try_reentrant_consume
              ((function_queue<double_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0>
                *)local_a0);
    bVar3 = density::builtin_optional::operator_cast_to_bool((builtin_optional *)local_a0);
    if (bVar3) {
      pdVar4 = density::builtin_optional<double>::operator*((builtin_optional<double> *)local_a0);
      this = (void *)std::ostream::operator<<(&std::cout,*pdVar4);
      std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
      queue_2.m_queue.m_tail._4_4_ = 0;
    }
    else {
      queue_2.m_queue.m_tail._4_4_ = 8;
    }
    density::builtin_optional<double>::~builtin_optional((builtin_optional<double> *)local_a0);
  } while (queue_2.m_queue.m_tail._4_4_ == 0);
  density::
  function_queue<double_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0>
  ::~function_queue((function_queue<double_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0>
                     *)local_88);
  density::
  function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0>
  ::function_queue((function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0>
                    *)local_b8);
  queue_3.m_queue.m_tail._4_4_ = 7;
  density::
  function_queue<void(),density::basic_default_allocator<65536ul>,(density::function_type_erasure)0>
  ::
  reentrant_emplace<density_tests::FunctionQueueSamples<(density::function_type_erasure)0>::func_queue_reentrant_put_samples(std::ostream&)::Func,int>
            ((function_queue<void(),density::basic_default_allocator<65536ul>,(density::function_type_erasure)0>
              *)local_b8,(int *)((long)&queue_3.m_queue.m_tail + 4));
  queue_3.m_queue.m_tail._3_1_ =
       density::
       function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0>
       ::try_reentrant_consume
                 ((function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0>
                   *)local_b8);
  if (!(bool)queue_3.m_queue.m_tail._3_1_) {
    __assert_fail("invoked",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/func_queue_examples.cpp"
                  ,0xf7,
                  "static void density_tests::FunctionQueueSamples<density::function_standard_erasure>::func_queue_reentrant_put_samples(std::ostream &) [ERASURE = density::function_standard_erasure]"
                 );
  }
  density::
  function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0>
  ::~function_queue((function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0>
                     *)local_b8);
  ppvVar1 = &transaction.m_put_data.m_user_storage;
  density::
  function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0>
  ::function_queue((function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0>
                    *)ppvVar1);
  _auStack_110 = (char *)0x0;
  local_108 = (char *)0x0;
  density::
  function_queue<void(),density::basic_default_allocator<65536ul>,(density::function_type_erasure)0>
  ::
  start_reentrant_push<density_tests::FunctionQueueSamples<(density::function_type_erasure)0>::func_queue_reentrant_put_samples(std::ostream&)::Func>
            (&local_100,
             (function_queue<void(),density::basic_default_allocator<65536ul>,(density::function_type_erasure)0>
              *)ppvVar1,(Func_conflict *)auStack_110);
  density::
  heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,void()>,density::basic_default_allocator<65536ul>>
  ::
  reentrant_put_transaction<density_tests::FunctionQueueSamples<(density::function_type_erasure)0>::func_queue_reentrant_put_samples(std::ostream&)::Func>
  ::
  reentrant_put_transaction<density_tests::FunctionQueueSamples<(density::function_type_erasure)0>::func_queue_reentrant_put_samples(std::ostream&)::Func,void>
            ((reentrant_put_transaction<density_tests::FunctionQueueSamples<(density::function_type_erasure)0>::func_queue_reentrant_put_samples(std::ostream&)::Func>
              *)local_e8,&local_100);
  density::
  heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>_>
  ::reentrant_put_transaction<Func>::~reentrant_put_transaction(&local_100);
  pvVar5 = density::
           heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>_>
           ::reentrant_put_transaction<Func>::raw_allocate_copy<char[12]>
                     ((reentrant_put_transaction<Func> *)local_e8,(char (*) [12])"Hello world");
  pFVar6 = density::
           heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>_>
           ::reentrant_put_transaction<Func>::element<Func,_nullptr>
                     ((reentrant_put_transaction<Func> *)local_e8);
  pFVar6->m_string_1 = pvVar5;
  pvVar5 = density::
           heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>_>
           ::reentrant_put_transaction<Func>::raw_allocate_copy<char[18]>
                     ((reentrant_put_transaction<Func> *)local_e8,
                      (char (*) [18])"\t(I\'m so happy)!!");
  pFVar6 = density::
           heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>_>
           ::reentrant_put_transaction<Func>::element<Func,_nullptr>
                     ((reentrant_put_transaction<Func> *)local_e8);
  pFVar6->m_string_2 = pvVar5;
  density::
  heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>_>
  ::reentrant_put_transaction<Func>::commit((reentrant_put_transaction<Func> *)local_e8);
  tVar2 = density::
          function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0>
          ::try_reentrant_consume
                    ((function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0>
                      *)&transaction.m_put_data.m_user_storage);
  if (!tVar2) {
    __assert_fail("invoked",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/func_queue_examples.cpp"
                  ,0x117,
                  "static void density_tests::FunctionQueueSamples<density::function_standard_erasure>::func_queue_reentrant_put_samples(std::ostream &) [ERASURE = density::function_standard_erasure]"
                 );
  }
  density::
  heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>_>
  ::reentrant_put_transaction<Func>::~reentrant_put_transaction
            ((reentrant_put_transaction<Func> *)local_e8);
  density::
  function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0>
  ::~function_queue((function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0>
                     *)&transaction.m_put_data.m_user_storage);
  ppvVar1 = &transaction_1.m_put_data.m_user_storage;
  density::
  function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0>
  ::function_queue((function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0>
                    *)ppvVar1);
  density::
  function_queue<void(),density::basic_default_allocator<65536ul>,(density::function_type_erasure)0>
  ::
  start_reentrant_emplace<density_tests::FunctionQueueSamples<(density::function_type_erasure)0>::func_queue_reentrant_put_samples(std::ostream&)::Func>
            ((reentrant_put_transaction<Func> *)local_158,
             (function_queue<void(),density::basic_default_allocator<65536ul>,(density::function_type_erasure)0>
              *)ppvVar1);
  density::
  heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,void()>,density::basic_default_allocator<65536ul>>
  ::
  reentrant_put_transaction<density_tests::FunctionQueueSamples<(density::function_type_erasure)0>::func_queue_reentrant_put_samples(std::ostream&)::Func>
  ::
  reentrant_put_transaction<density_tests::FunctionQueueSamples<(density::function_type_erasure)0>::func_queue_reentrant_put_samples(std::ostream&)::Func,void>
            ((reentrant_put_transaction<density_tests::FunctionQueueSamples<(density::function_type_erasure)0>::func_queue_reentrant_put_samples(std::ostream&)::Func>
              *)local_140,(reentrant_put_transaction<Func> *)local_158);
  density::
  heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>_>
  ::reentrant_put_transaction<Func>::~reentrant_put_transaction
            ((reentrant_put_transaction<Func> *)local_158);
  pvVar5 = density::
           heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>_>
           ::reentrant_put_transaction<Func>::raw_allocate_copy<char[12]>
                     ((reentrant_put_transaction<Func> *)local_140,(char (*) [12])"Hello world");
  pFVar6 = density::
           heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>_>
           ::reentrant_put_transaction<Func>::element<Func,_nullptr>
                     ((reentrant_put_transaction<Func> *)local_140);
  pFVar6->m_string_1 = pvVar5;
  pvVar5 = density::
           heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>_>
           ::reentrant_put_transaction<Func>::raw_allocate_copy<char[18]>
                     ((reentrant_put_transaction<Func> *)local_140,
                      (char (*) [18])"\t(I\'m so happy)!!");
  pFVar6 = density::
           heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>_>
           ::reentrant_put_transaction<Func>::element<Func,_nullptr>
                     ((reentrant_put_transaction<Func> *)local_140);
  pFVar6->m_string_2 = pvVar5;
  density::
  heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>_>
  ::reentrant_put_transaction<Func>::commit((reentrant_put_transaction<Func> *)local_140);
  tVar2 = density::
          function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0>
          ::try_reentrant_consume
                    ((function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0>
                      *)&transaction_1.m_put_data.m_user_storage);
  if (!tVar2) {
    __assert_fail("invoked",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/func_queue_examples.cpp"
                  ,0x135,
                  "static void density_tests::FunctionQueueSamples<density::function_standard_erasure>::func_queue_reentrant_put_samples(std::ostream &) [ERASURE = density::function_standard_erasure]"
                 );
  }
  density::
  heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>_>
  ::reentrant_put_transaction<Func>::~reentrant_put_transaction
            ((reentrant_put_transaction<Func> *)local_140);
  density::
  function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0>
  ::~function_queue((function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0>
                     *)&transaction_1.m_put_data.m_user_storage);
  PrintScopeDuration::~PrintScopeDuration((PrintScopeDuration *)&queue.m_queue.m_tail);
  return;
}

Assistant:

static void func_queue_reentrant_put_samples(std::ostream & i_ostream)
        {
            PrintScopeDuration dur(i_ostream, "function queue reentrant put samples");

            using namespace density;

            {
                //! [function_queue reentrant_push example 1]
                function_queue<void(), default_allocator, ERASURE> queue;
                queue.reentrant_push([] { std::cout << "Hello"; });
                queue.reentrant_push([] { std::cout << " world"; });
                queue.reentrant_push([] { std::cout << "!!!"; });
                queue.reentrant_push([] { std::cout << std::endl; });
                while (queue.try_reentrant_consume())
                    ;
                //! [function_queue reentrant_push example 1]
            }
            {
                //! [function_queue reentrant_push example 2]
                double last_val = 1.;

                auto func = [&last_val] { return last_val /= 2.; };

                function_queue<double(), default_allocator, ERASURE> queue;
                for (int i = 0; i < 10; i++)
                    queue.reentrant_push(func);

                while (auto const return_value = queue.try_reentrant_consume())
                    std::cout << *return_value << std::endl;
                //! [function_queue reentrant_push example 2]
            }
            {
                //! [function_queue reentrant_emplace example 1]
                /* This local struct is unmovable and uncopyable, so emplace is the only
                    option to add it to the queue. Note that operator () returns an int,
                    but we add it to a void() function queue. This is ok, as we are just
                    discarding the return value. */
                struct Func
                {
                    int const m_value;

                    Func(int i_value) : m_value(i_value) {}

                    Func(const Func &) = delete;
                    Func & operator=(const Func &) = delete;

                    int operator()() const
                    {
                        std::cout << m_value << std::endl;
                        return m_value;
                    }
                };

                function_queue<void(), default_allocator, ERASURE> queue;
                queue.template reentrant_emplace<Func>(7);

                bool const invoked = queue.try_reentrant_consume();
                assert(invoked);
                //! [function_queue reentrant_emplace example 1]
                (void)invoked;
            }
            {
                //! [function_queue start_reentrant_push example 1]
                struct Func
                {
                    const char * m_string_1;
                    const char * m_string_2;

                    void operator()()
                    {
                        std::cout << m_string_1 << std::endl;
                        std::cout << m_string_2 << std::endl;
                    }
                };

                function_queue<void(), default_allocator, ERASURE> queue;

                auto transaction = queue.start_reentrant_push(Func{});

                // in case of exception here, since the transaction is not committed, it is discarded with no observable effects
                transaction.element().m_string_1 = transaction.raw_allocate_copy("Hello world");
                transaction.element().m_string_2 =
                  transaction.raw_allocate_copy("\t(I'm so happy)!!");

                transaction.commit();

                // now transaction is empty

                bool const invoked = queue.try_reentrant_consume();
                assert(invoked);
                //! [function_queue start_reentrant_push example 1]
                (void)invoked;
            }
            {
                //! [function_queue start_reentrant_emplace example 1]
                struct Func
                {
                    const char * m_string_1;
                    const char * m_string_2;

                    void operator()()
                    {
                        std::cout << m_string_1 << std::endl;
                        std::cout << m_string_2 << std::endl;
                    }
                };

                function_queue<void(), default_allocator, ERASURE> queue;

                auto transaction = queue.template start_reentrant_emplace<Func>();

                // in case of exception here, since the transaction is not committed, it is discarded with no observable effects
                transaction.element().m_string_1 = transaction.raw_allocate_copy("Hello world");
                transaction.element().m_string_2 =
                  transaction.raw_allocate_copy("\t(I'm so happy)!!");

                transaction.commit();

                bool const invoked = queue.try_reentrant_consume();
                assert(invoked);
                //! [function_queue start_reentrant_emplace example 1]
                (void)invoked;
            }
        }